

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkField
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  int i;
  int32 i_00;
  string *psVar1;
  _Node **pp_Var2;
  PlaceholderType placeholder_type;
  bool bVar3;
  Type TVar4;
  FieldOptions *pFVar5;
  _Alloc_hider _Var6;
  _Node *p_Var7;
  ulong uVar8;
  size_t sVar9;
  long *plVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  size_type *psVar12;
  anon_union_8_7_bfa3a334_for_Symbol_2 aVar13;
  FieldDescriptor *pFVar14;
  ulong uVar15;
  bool bVar16;
  Symbol SVar17;
  undefined8 local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228 [2];
  size_type __dnew;
  int local_200;
  char local_1fc [4];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8 [2];
  string *local_1d8;
  string local_1d0;
  undefined1 local_1b0 [48];
  undefined1 local_180 [48];
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  if (*(long *)(field + 0x60) == 0) {
    pFVar5 = FieldOptions::default_instance();
    *(FieldOptions **)(field + 0x60) = pFVar5;
  }
  if ((proto->_has_bits_[0] & 0x20) == 0) {
LAB_001d6aa1:
    if ((proto->_has_bits_[0] & 0x10) == 0) {
      if ((*(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4) | 2)
          == 10) {
        psVar1 = *(string **)(field + 8);
        __dnew = 0x32;
        _Var6._M_p = (pointer)std::__cxx11::string::_M_create
                                        ((ulong *)&stack0xfffffffffffffdc8,(ulong)&__dnew);
        local_228[0]._M_allocated_capacity = __dnew;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0x20) = 'm';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0x21) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0x22) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0x23) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0x24) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0x25) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0x26) = 'g';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0x27) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0x28) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0x29) = 'y';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0x2a) = 'p';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0x2b) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0x2c) = '_';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0x2d) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0x2e) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0x2f) = 'm';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0x10) = 'g';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0x11) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0x12) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0x13) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0x14) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0x15) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0x16) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0x17) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0x18) = 'u';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0x19) = 'm';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0x1a) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0x1b) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0x1c) = 'y';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0x1d) = 'p';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0x1e) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0x1f) = ' ';
        *(undefined8 *)_Var6._M_p = 0x697720646c656946;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 8) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 9) = 'h';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 10) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0xb) = 'm';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0xc) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0xd) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0xe) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0xf) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0x30) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p + 0x31) = '.';
        local_230 = __dnew;
        _Var6._M_p[__dnew] = '\0';
        AddError(this,psVar1,&proto->super_Message,TYPE,(string *)&stack0xfffffffffffffdc8);
LAB_001d6b3b:
        local_180._16_8_ = local_228[0]._M_allocated_capacity;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var6._M_p != local_228) {
LAB_001d6b49:
          operator_delete(_Var6._M_p,local_180._16_8_ + 1);
        }
      }
    }
    else {
      placeholder_type = proto->_has_bits_[0] >> 6 & PLACEHOLDER_ENUM;
      if (proto->type_ == 0xe) {
        placeholder_type = PLACEHOLDER_ENUM;
      }
      SVar17 = LookupSymbol(this,proto->type_name_,*(string **)(field + 8),placeholder_type,
                            LOOKUP_TYPES);
      aVar13 = SVar17.field_1;
      TVar4 = SVar17.type;
      if (TVar4 == NULL_SYMBOL) {
        AddNotDefinedError(this,*(string **)(field + 8),&proto->super_Message,TYPE,proto->type_name_
                          );
        return;
      }
      if ((proto->_has_bits_[0] & 8) != 0) {
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4) == 8)
        {
          if (TVar4 == ENUM) goto LAB_001d6fe4;
          psVar1 = *(string **)(field + 8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__dnew,"\"",proto->type_name_);
          plVar10 = (long *)std::__cxx11::string::append((char *)&__dnew);
          _Var6._M_p = (pointer)local_228;
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 == paVar11) {
            local_228[0]._0_8_ = paVar11->_M_allocated_capacity;
            local_228[0]._8_8_ = plVar10[3];
          }
          else {
            local_228[0]._0_8_ = paVar11->_M_allocated_capacity;
            _Var6._M_p = (pointer)*plVar10;
          }
          local_230 = plVar10[1];
          *plVar10 = (long)paVar11;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          AddError(this,psVar1,&proto->super_Message,TYPE,(string *)&stack0xfffffffffffffdc8);
        }
        else {
          if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4) !=
              10) {
            psVar1 = *(string **)(field + 8);
            __dnew = 0x28;
            _Var6._M_p = (pointer)std::__cxx11::string::_M_create
                                            ((ulong *)&stack0xfffffffffffffdc8,(ulong)&__dnew);
            local_228[0]._M_allocated_capacity = __dnew;
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var6._M_p + 0x10) = 't';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var6._M_p + 0x11) = 'i';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var6._M_p + 0x12) = 'v';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var6._M_p + 0x13) = 'e';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var6._M_p + 0x14) = ' ';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var6._M_p + 0x15) = 't';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var6._M_p + 0x16) = 'y';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var6._M_p + 0x17) = 'p';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var6._M_p + 0x18) = 'e';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var6._M_p + 0x19) = ' ';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var6._M_p + 0x1a) = 'h';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var6._M_p + 0x1b) = 'a';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var6._M_p + 0x1c) = 's';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var6._M_p + 0x1d) = ' ';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var6._M_p + 0x1e) = 't';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var6._M_p + 0x1f) = 'y';
            *(undefined8 *)_Var6._M_p = 0x697720646c656946;
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var6._M_p + 8) = 't';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var6._M_p + 9) = 'h';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var6._M_p + 10) = ' ';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var6._M_p + 0xb) = 'p';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var6._M_p + 0xc) = 'r';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var6._M_p + 0xd) = 'i';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var6._M_p + 0xe) = 'm';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var6._M_p + 0xf) = 'i';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var6._M_p + 0x20) = 'p';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var6._M_p + 0x21) = 'e';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var6._M_p + 0x22) = '_';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var6._M_p + 0x23) = 'n';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var6._M_p + 0x24) = 'a';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var6._M_p + 0x25) = 'm';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var6._M_p + 0x26) = 'e';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var6._M_p + 0x27) = '.';
            local_230 = __dnew;
            _Var6._M_p[__dnew] = '\0';
            AddError(this,psVar1,&proto->super_Message,TYPE,(string *)&stack0xfffffffffffffdc8);
            goto LAB_001d6b3b;
          }
          if (TVar4 == MESSAGE) goto LAB_001d6f5e;
          psVar1 = *(string **)(field + 8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__dnew,"\"",proto->type_name_);
          plVar10 = (long *)std::__cxx11::string::append((char *)&__dnew);
          _Var6._M_p = (pointer)local_228;
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 == paVar11) {
            local_228[0]._0_8_ = paVar11->_M_allocated_capacity;
            local_228[0]._8_8_ = plVar10[3];
          }
          else {
            local_228[0]._0_8_ = paVar11->_M_allocated_capacity;
            _Var6._M_p = (pointer)*plVar10;
          }
          local_230 = plVar10[1];
          *plVar10 = (long)paVar11;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          AddError(this,psVar1,&proto->super_Message,TYPE,(string *)&stack0xfffffffffffffdc8);
        }
        goto LAB_001d6f1c;
      }
      if (TVar4 == MESSAGE) {
        *(undefined4 *)(field + 0x2c) = 0xb;
LAB_001d6f5e:
        ((anon_union_8_7_bfa3a334_for_Symbol_2 *)(field + 0x48))->descriptor = (Descriptor *)aVar13;
        if (field[0x68] == (FieldDescriptor)0x1) {
          psVar1 = *(string **)(field + 8);
          __dnew = 0x23;
          _Var6._M_p = (pointer)std::__cxx11::string::_M_create
                                          ((ulong *)&stack0xfffffffffffffdc8,(ulong)&__dnew);
          local_228[0]._M_allocated_capacity = __dnew;
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var6._M_p + 0x10) = 'a';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var6._M_p + 0x11) = 'v';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var6._M_p + 0x12) = 'e';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var6._M_p + 0x13) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var6._M_p + 0x14) = 'd';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var6._M_p + 0x15) = 'e';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var6._M_p + 0x16) = 'f';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var6._M_p + 0x17) = 'a';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var6._M_p + 0x18) = 'u';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var6._M_p + 0x19) = 'l';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var6._M_p + 0x1a) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var6._M_p + 0x1b) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var6._M_p + 0x1c) = 'v';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var6._M_p + 0x1d) = 'a';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var6._M_p + 0x1e) = 'l';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var6._M_p + 0x1f) = 'u';
          *(undefined8 *)_Var6._M_p = 0x736567617373654d;
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var6._M_p + 8) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var6._M_p + 9) = 'c';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var6._M_p + 10) = 'a';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var6._M_p + 0xb) = 'n';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var6._M_p + 0xc) = '\'';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var6._M_p + 0xd) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var6._M_p + 0xe) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var6._M_p + 0xf) = 'h';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var6._M_p + 0x1f) = 'u';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var6._M_p + 0x20) = 'e';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var6._M_p + 0x21) = 's';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var6._M_p + 0x22) = '.';
          local_230 = __dnew;
          _Var6._M_p[__dnew] = '\0';
          AddError(this,psVar1,&proto->super_Message,DEFAULT_VALUE,
                   (string *)&stack0xfffffffffffffdc8);
          goto LAB_001d6b3b;
        }
      }
      else {
        if (TVar4 != ENUM) {
          psVar1 = *(string **)(field + 8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__dnew,"\"",proto->type_name_);
          plVar10 = (long *)std::__cxx11::string::append((char *)&__dnew);
          _Var6._M_p = (pointer)local_228;
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 == paVar11) {
            local_228[0]._0_8_ = paVar11->_M_allocated_capacity;
            local_228[0]._8_8_ = plVar10[3];
          }
          else {
            local_228[0]._0_8_ = paVar11->_M_allocated_capacity;
            _Var6._M_p = (pointer)*plVar10;
          }
          local_230 = plVar10[1];
          *plVar10 = (long)paVar11;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          AddError(this,psVar1,&proto->super_Message,TYPE,(string *)&stack0xfffffffffffffdc8);
          goto LAB_001d6f1c;
        }
        *(undefined4 *)(field + 0x2c) = 0xe;
LAB_001d6fe4:
        ((anon_union_8_7_bfa3a334_for_Symbol_2 *)(field + 0x50))->descriptor = (Descriptor *)aVar13;
        if (aVar13.descriptor[0x28] == (Descriptor)0x1) {
          field[0x68] = (FieldDescriptor)0x0;
        }
        else if (((byte)field[0x68] & 1) != 0) {
          SVar17 = LookupSymbolNoPlaceholder
                             (this,proto->default_value_,*(string **)(aVar13.descriptor + 8),
                              LOOKUP_ALL);
          if ((SVar17.type == ENUM_VALUE) &&
             (*(long *)(SVar17.field_1.descriptor + 0x18) == *(long *)(field + 0x50))) {
            ((anon_union_8_7_bfa3a334_for_Symbol_2 *)(field + 0x70))->descriptor =
                 (Descriptor *)SVar17.field_1;
          }
          else {
            psVar1 = *(string **)(field + 8);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_180,"Enum type \"",
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            (*(long *)(field + 0x50) + 8));
            plVar10 = (long *)std::__cxx11::string::append((char *)local_180);
            psVar12 = (size_type *)(plVar10 + 2);
            if ((size_type *)*plVar10 == psVar12) {
              local_1b0._16_8_ = *psVar12;
              local_1b0._24_8_ = plVar10[3];
              local_1b0._0_8_ = local_1b0 + 0x10;
            }
            else {
              local_1b0._16_8_ = *psVar12;
              local_1b0._0_8_ = (size_type *)*plVar10;
            }
            local_1b0._8_8_ = plVar10[1];
            *plVar10 = (long)psVar12;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &__dnew,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_1b0,proto->default_value_);
            plVar10 = (long *)std::__cxx11::string::append((char *)&__dnew);
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 == paVar11) {
              local_228[0]._0_8_ = paVar11->_M_allocated_capacity;
              local_228[0]._8_8_ = plVar10[3];
              _Var6._M_p = (pointer)local_228;
            }
            else {
              local_228[0]._0_8_ = paVar11->_M_allocated_capacity;
              _Var6._M_p = (pointer)*plVar10;
            }
            local_230 = plVar10[1];
            *plVar10 = (long)paVar11;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            AddError(this,psVar1,&proto->super_Message,DEFAULT_VALUE,
                     (string *)&stack0xfffffffffffffdc8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var6._M_p != local_228) {
              operator_delete(_Var6._M_p,local_228[0]._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__dnew != local_1f8) {
              operator_delete((void *)__dnew,local_1f8[0]._M_allocated_capacity + 1);
            }
            if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
              operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
            }
            _Var6._M_p = (pointer)local_180._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_180 + 0x10)) goto LAB_001d6b49;
          }
          goto LAB_001d6b51;
        }
        if (0 < *(int *)(aVar13.descriptor + 0x2c)) {
          *(undefined8 *)(field + 0x70) = *(undefined8 *)(aVar13.descriptor + 0x30);
        }
      }
    }
LAB_001d6b51:
    bVar3 = FileDescriptorTables::AddFieldByNumber(this->file_tables_,field);
    if (!bVar3) {
      i = *(int *)(field + 0x28);
      pp_Var2 = (this->file_tables_->fields_by_number_).
                super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
                .
                super___unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_false>
                .
                super__Hashtable<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::_Select1st<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                ._M_buckets;
      uVar8 = (this->file_tables_->fields_by_number_).
              super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
              .
              super___unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_false>
              .
              super__Hashtable<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::_Select1st<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
              ._M_bucket_count;
      pFVar14 = (FieldDescriptor *)0x0;
      p_Var7 = pp_Var2[(ulong)((long)*(Descriptor **)(field + 0x38) * 0xffff + (long)i) % uVar8];
      if (p_Var7 != (_Node *)0x0) {
        pFVar14 = (FieldDescriptor *)0x0;
        do {
          if (((p_Var7->_M_v).first.first == *(Descriptor **)(field + 0x38)) &&
             ((p_Var7->_M_v).first.second == i)) {
            if (p_Var7 == pp_Var2[uVar8]) {
              pFVar14 = (FieldDescriptor *)0x0;
            }
            else {
              pFVar14 = (p_Var7->_M_v).second;
            }
            break;
          }
          p_Var7 = p_Var7->_M_next;
        } while (p_Var7 != (_Hash_node<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_false>
                            *)0x0);
      }
      local_1d8 = *(string **)(field + 8);
      if (field[0x34] == (FieldDescriptor)0x1) {
        _Var6._M_p = FastInt32ToBuffer(i,(char *)((long)&local_230 + 4));
        sVar9 = strlen(_Var6._M_p);
        local_230 = CONCAT44(local_230._4_4_,(int)sVar9);
        __dnew = **(size_type **)(*(long *)(field + 0x38) + 8);
        local_200 = (int)(*(size_type **)(*(long *)(field + 0x38) + 8))[1];
        local_1b0._0_8_ = **(undefined8 **)(pFVar14 + 8);
        local_1b0._8_4_ = *(undefined4 *)(*(undefined8 **)(pFVar14 + 8) + 1);
        local_180._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_180._8_4_ = -1;
        local_60.text_ = (char *)0x0;
        local_60.size_ = -1;
        local_90.text_ = (char *)0x0;
        local_90.size_ = -1;
        local_c0.text_ = (char *)0x0;
        local_c0.size_ = -1;
        local_f0.text_ = (char *)0x0;
        local_f0.size_ = -1;
        local_120.text_ = (char *)0x0;
        local_120.size_ = -1;
        local_150.text_ = (char *)0x0;
        local_150.size_ = -1;
        strings::Substitute_abi_cxx11_
                  (&local_1d0,
                   (strings *)
                   "Extension number $0 has already been used in \"$1\" by extension \"$2\".",
                   &stack0xfffffffffffffdc8,(SubstituteArg *)&__dnew,(SubstituteArg *)local_1b0,
                   (SubstituteArg *)local_180,&local_60,&local_90,&local_c0,&local_f0,&local_120,
                   &local_150,(SubstituteArg *)_Var6._M_p);
        AddError(this,local_1d8,&proto->super_Message,NUMBER,&local_1d0);
      }
      else {
        _Var6._M_p = FastInt32ToBuffer(i,(char *)((long)&local_230 + 4));
        sVar9 = strlen(_Var6._M_p);
        local_230 = CONCAT44(local_230._4_4_,(int)sVar9);
        __dnew = **(size_type **)(*(long *)(field + 0x38) + 8);
        local_200 = (int)(*(size_type **)(*(long *)(field + 0x38) + 8))[1];
        local_1b0._0_8_ = **(undefined8 **)pFVar14;
        local_1b0._8_4_ = *(undefined4 *)(*(undefined8 **)pFVar14 + 1);
        local_180._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_180._8_4_ = -1;
        local_60.text_ = (char *)0x0;
        local_60.size_ = -1;
        local_90.text_ = (char *)0x0;
        local_90.size_ = -1;
        local_c0.text_ = (char *)0x0;
        local_c0.size_ = -1;
        local_f0.text_ = (char *)0x0;
        local_f0.size_ = -1;
        local_120.text_ = (char *)0x0;
        local_120.size_ = -1;
        local_150.text_ = (char *)0x0;
        local_150.size_ = -1;
        strings::Substitute_abi_cxx11_
                  (&local_1d0,
                   (strings *)"Field number $0 has already been used in \"$1\" by field \"$2\".",
                   &stack0xfffffffffffffdc8,(SubstituteArg *)&__dnew,(SubstituteArg *)local_1b0,
                   (SubstituteArg *)local_180,&local_60,&local_90,&local_c0,&local_f0,&local_120,
                   &local_150,(SubstituteArg *)_Var6._M_p);
        AddError(this,local_1d8,&proto->super_Message,NUMBER,&local_1d0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
    }
    if (field[0x34] == (FieldDescriptor)0x1) {
      DescriptorPool::Tables::AddExtension(this->tables_,field);
    }
    FileDescriptorTables::AddFieldByStylizedNames(this->file_tables_,field);
  }
  else {
    SVar17 = LookupSymbol(this,proto->extendee_,*(string **)(field + 8),
                          PLACEHOLDER_EXTENDABLE_MESSAGE,LOOKUP_ALL);
    aVar13 = SVar17.field_1;
    if (SVar17.type == MESSAGE) {
      ((anon_union_8_7_bfa3a334_for_Symbol_2 *)(field + 0x38))->descriptor = (Descriptor *)aVar13;
      i_00 = *(int32 *)(field + 0x28);
      uVar8 = (ulong)*(int *)(aVar13.descriptor + 0x58);
      if (0 < (long)uVar8) {
        bVar3 = true;
        uVar15 = 1;
        do {
          if ((*(int *)(*(long *)(aVar13.descriptor + 0x60) + -8 + uVar15 * 8) <= i_00) &&
             (i_00 < *(int *)(*(long *)(aVar13.descriptor + 0x60) + -4 + uVar15 * 8))) break;
          bVar3 = uVar15 < uVar8;
          bVar16 = uVar15 != uVar8;
          uVar15 = uVar15 + 1;
        } while (bVar16);
        if (bVar3) goto LAB_001d6aa1;
      }
      local_1d8 = *(string **)(field + 8);
      _Var6._M_p = (pointer)**(undefined8 **)(aVar13.descriptor + 8);
      local_230 = CONCAT44(local_230._4_4_,
                           *(undefined4 *)(*(undefined8 **)(aVar13.descriptor + 8) + 1));
      __dnew = (size_type)FastInt32ToBuffer(i_00,local_1fc);
      sVar9 = strlen((char *)__dnew);
      local_200 = (int)sVar9;
      local_1b0._0_8_ = (char *)0x0;
      local_1b0._8_4_ = 0xffffffff;
      local_180._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_180._8_4_ = -1;
      local_60.text_ = (char *)0x0;
      local_60.size_ = -1;
      local_90.text_ = (char *)0x0;
      local_90.size_ = -1;
      local_c0.text_ = (char *)0x0;
      local_c0.size_ = -1;
      local_f0.text_ = (char *)0x0;
      local_f0.size_ = -1;
      local_120.text_ = (char *)0x0;
      local_120.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      strings::Substitute_abi_cxx11_
                (&local_1d0,(strings *)"\"$0\" does not declare $1 as an extension number.",
                 &stack0xfffffffffffffdc8,(SubstituteArg *)&__dnew,(SubstituteArg *)local_1b0,
                 (SubstituteArg *)local_180,&local_60,&local_90,&local_c0,&local_f0,&local_120,
                 &local_150,(SubstituteArg *)_Var6._M_p);
      AddError(this,local_1d8,&proto->super_Message,NUMBER,&local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      goto LAB_001d6aa1;
    }
    if (SVar17.type == NULL_SYMBOL) {
      AddNotDefinedError(this,*(string **)(field + 8),&proto->super_Message,EXTENDEE,
                         proto->extendee_);
      return;
    }
    psVar1 = *(string **)(field + 8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__dnew,"\""
                   ,proto->extendee_);
    plVar10 = (long *)std::__cxx11::string::append((char *)&__dnew);
    _Var6._M_p = (pointer)local_228;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 == paVar11) {
      local_228[0]._0_8_ = paVar11->_M_allocated_capacity;
      local_228[0]._8_8_ = plVar10[3];
    }
    else {
      local_228[0]._0_8_ = paVar11->_M_allocated_capacity;
      _Var6._M_p = (pointer)*plVar10;
    }
    local_230 = plVar10[1];
    *plVar10 = (long)paVar11;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    AddError(this,psVar1,&proto->super_Message,EXTENDEE,(string *)&stack0xfffffffffffffdc8);
LAB_001d6f1c:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var6._M_p != local_228) {
      operator_delete(_Var6._M_p,local_228[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__dnew != local_1f8) {
      operator_delete((void *)__dnew,local_1f8[0]._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkField(
    FieldDescriptor* field, const FieldDescriptorProto& proto) {
  if (field->options_ == NULL) {
    field->options_ = &FieldOptions::default_instance();
  }

  if (proto.has_extendee()) {
    Symbol extendee = LookupSymbol(proto.extendee(), field->full_name(),
                                   PLACEHOLDER_EXTENDABLE_MESSAGE);
    if (extendee.IsNull()) {
      AddNotDefinedError(field->full_name(), proto,
                         DescriptorPool::ErrorCollector::EXTENDEE,
                         proto.extendee());
      return;
    } else if (extendee.type != Symbol::MESSAGE) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE,
               "\"" + proto.extendee() + "\" is not a message type.");
      return;
    }
    field->containing_type_ = extendee.descriptor;

    if (!field->containing_type()->IsExtensionNumber(field->number())) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NUMBER,
               strings::Substitute("\"$0\" does not declare $1 as an "
                                   "extension number.",
                                   field->containing_type()->full_name(),
                                   field->number()));
    }
  }

  if (proto.has_type_name()) {
    // Assume we are expecting a message type unless the proto contains some
    // evidence that it expects an enum type.  This only makes a difference if
    // we end up creating a placeholder.
    bool expecting_enum = (proto.type() == FieldDescriptorProto::TYPE_ENUM) ||
                          proto.has_default_value();

    Symbol type =
      LookupSymbol(proto.type_name(), field->full_name(),
                   expecting_enum ? PLACEHOLDER_ENUM : PLACEHOLDER_MESSAGE,
                   LOOKUP_TYPES);

    if (type.IsNull()) {
      AddNotDefinedError(field->full_name(), proto,
                         DescriptorPool::ErrorCollector::TYPE,
                         proto.type_name());
      return;
    }

    if (!proto.has_type()) {
      // Choose field type based on symbol.
      if (type.type == Symbol::MESSAGE) {
        field->type_ = FieldDescriptor::TYPE_MESSAGE;
      } else if (type.type == Symbol::ENUM) {
        field->type_ = FieldDescriptor::TYPE_ENUM;
      } else {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "\"" + proto.type_name() + "\" is not a type.");
        return;
      }
    }

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      if (type.type != Symbol::MESSAGE) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "\"" + proto.type_name() + "\" is not a message type.");
        return;
      }
      field->message_type_ = type.descriptor;

      if (field->has_default_value()) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                 "Messages can't have default values.");
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      if (type.type != Symbol::ENUM) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "\"" + proto.type_name() + "\" is not an enum type.");
        return;
      }
      field->enum_type_ = type.enum_descriptor;

      if (field->enum_type()->is_placeholder_) {
        // We can't look up default values for placeholder types.  We'll have
        // to just drop them.
        field->has_default_value_ = false;
      }

      if (field->has_default_value()) {
        // We can't just use field->enum_type()->FindValueByName() here
        // because that locks the pool's mutex, which we have already locked
        // at this point.
        Symbol default_value =
          LookupSymbolNoPlaceholder(proto.default_value(),
                                    field->enum_type()->full_name());

        if (default_value.type == Symbol::ENUM_VALUE &&
            default_value.enum_value_descriptor->type() == field->enum_type()) {
          field->default_value_enum_ = default_value.enum_value_descriptor;
        } else {
          AddError(field->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                   "Enum type \"" + field->enum_type()->full_name() +
                   "\" has no value named \"" + proto.default_value() + "\".");
        }
      } else if (field->enum_type()->value_count() > 0) {
        // All enums must have at least one value, or we would have reported
        // an error elsewhere.  We use the first defined value as the default
        // if a default is not explicitly defined.
        field->default_value_enum_ = field->enum_type()->value(0);
      }
    } else {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "Field with primitive type has type_name.");
    }
  } else {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ||
        field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "Field with message or enum type missing type_name.");
    }
  }

  // Add the field to the fields-by-number table.
  // Note:  We have to do this *after* cross-linking because extensions do not
  //   know their containing type until now.
  if (!file_tables_->AddFieldByNumber(field)) {
    const FieldDescriptor* conflicting_field =
      file_tables_->FindFieldByNumber(field->containing_type(),
                                      field->number());
    if (field->is_extension()) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NUMBER,
               strings::Substitute("Extension number $0 has already been used "
                                   "in \"$1\" by extension \"$2\".",
                                   field->number(),
                                   field->containing_type()->full_name(),
                                   conflicting_field->full_name()));
    } else {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NUMBER,
               strings::Substitute("Field number $0 has already been used in "
                                   "\"$1\" by field \"$2\".",
                                   field->number(),
                                   field->containing_type()->full_name(),
                                   conflicting_field->name()));
    }
  }

  if (field->is_extension()) {
    // No need for error checking: if the extension number collided,
    // we've already been informed of it by the if() above.
    tables_->AddExtension(field);
  }

  // Add the field to the lowercase-name and camelcase-name tables.
  file_tables_->AddFieldByStylizedNames(field);
}